

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaAttrInfoPtr xmlSchemaGetMetaAttrInfo(xmlSchemaValidCtxtPtr vctxt,int metaType)

{
  xmlSchemaAttrInfoPtr *ppxVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = vctxt->nbAttrInfos;
  if (uVar2 != 0) {
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = 0;
    }
    uVar4 = 0;
    while (uVar3 != uVar4) {
      ppxVar1 = vctxt->attrInfos + uVar4;
      uVar4 = uVar4 + 1;
      if ((*ppxVar1)->metaType == metaType) {
        return *ppxVar1;
      }
    }
  }
  return (xmlSchemaAttrInfoPtr)0x0;
}

Assistant:

static xmlSchemaAttrInfoPtr
xmlSchemaGetMetaAttrInfo(xmlSchemaValidCtxtPtr vctxt,
			 int metaType)
{
    if (vctxt->nbAttrInfos == 0)
	return (NULL);
    {
	int i;
	xmlSchemaAttrInfoPtr iattr;

	for (i = 0; i < vctxt->nbAttrInfos; i++) {
	    iattr = vctxt->attrInfos[i];
	    if (iattr->metaType == metaType)
		return (iattr);
	}

    }
    return (NULL);
}